

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O2

void __thiscall
HighsSparseMatrix::priceByRowWithSwitch
          (HighsSparseMatrix *this,bool quad_precision,HVector *result,HVector *column,
          double expected_density,HighsInt from_index,double switch_density,HighsInt debug_report)

{
  int *piVar1;
  double dVar2;
  int iVar3;
  int to_iEl;
  uint uVar4;
  pointer pdVar5;
  pointer piVar6;
  pointer pdVar7;
  pointer piVar8;
  int *piVar9;
  double *pdVar10;
  ulong uVar11;
  undefined7 in_register_00000031;
  size_type __new_size;
  long lVar12;
  ulong uVar13;
  HighsInt debug_report_00;
  ulong uVar14;
  HighsInt iEl;
  int iVar15;
  double dVar16;
  double dVar17;
  HighsSparseVectorSum sum;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> result_array;
  
  uVar14 = (ulong)(uint)from_index;
  uVar11 = (ulong)(uint)from_index;
  sum.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  sum.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  sum.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sum.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  sum.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sum.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((int)CONCAT71(in_register_00000031,quad_precision) != 0) {
    HighsSparseVectorSum::setDimension(&sum,this->num_col_);
  }
  if (-2 < debug_report) {
    puts("\nHighsSparseMatrix::priceByRowWithSwitch");
  }
  if (expected_density <= 0.1) {
    iVar15 = this->num_col_;
    uVar13 = (ulong)from_index;
    while (from_index = (HighsInt)uVar11, (long)uVar13 < (long)column->count) {
      iVar3 = (column->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar13];
      piVar1 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + (long)iVar3 + 1;
      piVar9 = (this->p_end_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + iVar3;
      if (this->format_ != kRowwisePartitioned) {
        piVar9 = piVar1;
      }
      to_iEl = *piVar9;
      if ((this->num_col_ <= (to_iEl - piVar1[-1]) + result->count) ||
         (switch_density < (double)result->count * (1.0 / (double)iVar15))) break;
      dVar17 = (column->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar3];
      if ((debug_report == -1) || (iVar3 == debug_report)) {
        debugReportRowPrice(this,iVar3,dVar17,to_iEl,&result->array);
      }
      if ((dVar17 != 0.0) || (NAN(dVar17))) {
        lVar12 = (long)(this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar3];
        if (quad_precision) {
          for (; lVar12 < to_iEl; lVar12 = lVar12 + 1) {
            HighsSparseVectorSum::add
                      (&sum,(this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar12],
                       (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar12] * dVar17);
          }
        }
        else {
          piVar6 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar7 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8 = (result->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar5 = (result->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          for (; lVar12 < to_iEl; lVar12 = lVar12 + 1) {
            uVar4 = piVar6[lVar12];
            uVar14 = (ulong)uVar4;
            dVar16 = pdVar5[(int)uVar4];
            dVar2 = pdVar7[lVar12];
            if ((dVar16 == 0.0) && (!NAN(dVar16))) {
              iVar3 = result->count;
              result->count = iVar3 + 1;
              piVar8[iVar3] = uVar4;
            }
            dVar16 = dVar2 * dVar17 + dVar16;
            uVar11 = -(ulong)(ABS(dVar16) < 1e-14);
            pdVar5[(int)uVar4] = (double)(~uVar11 & (ulong)dVar16 | uVar11 & 0x358dee7a4ad4b81f);
          }
        }
        uVar13 = uVar13 + 1;
        uVar11 = uVar13 & 0xffffffff;
      }
      else {
        uVar11 = (ulong)((int)uVar13 + 1);
        uVar13 = uVar13 + 1;
      }
    }
  }
  if (quad_precision) {
    uVar11 = (ulong)((long)sum.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)sum.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
    uVar13 = uVar11 & 0xffffffff;
    while( true ) {
      debug_report_00 = (HighsInt)uVar14;
      __new_size = (size_type)(int)uVar11;
      if ((int)uVar13 < 1) break;
      iVar15 = sum.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar13 - 1];
      uVar14 = (ulong)iVar15;
      uVar13 = uVar13 - 1;
      if (ABS(sum.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
              super__Vector_impl_data._M_start[uVar14].hi +
              sum.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
              super__Vector_impl_data._M_start[uVar14].lo) <= 1e-14) {
        uVar11 = (ulong)((int)uVar11 - 1);
        sum.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
        super__Vector_impl_data._M_start[uVar14].hi = 0.0;
        sum.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
        super__Vector_impl_data._M_start[uVar14].lo = 0.0;
        iVar3 = sum.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[__new_size - 1];
        sum.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[__new_size - 1] = iVar15;
        sum.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar13] = iVar3;
      }
    }
    std::vector<int,_std::allocator<int>_>::resize(&sum.nonzeroinds,__new_size);
    if (from_index < column->count) {
      std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::vector(&result_array,&sum.values);
      priceByRowDenseResult(this,&result_array,column,from_index,debug_report_00);
      result->count = 0;
      piVar6 = (result->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (result->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar10 = &(result_array.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                  _M_impl.super__Vector_impl_data._M_start)->lo;
      for (lVar12 = 0; lVar12 < this->num_col_; lVar12 = lVar12 + 1) {
        dVar16 = ((HighsCDouble *)(pdVar10 + -1))->hi + *pdVar10;
        dVar17 = 0.0;
        if (1e-14 <= ABS(dVar16)) {
          iVar15 = result->count;
          result->count = iVar15 + 1;
          piVar6[iVar15] = (int)lVar12;
          dVar17 = dVar16;
        }
        pdVar7[lVar12] = dVar17;
        pdVar10 = pdVar10 + 2;
      }
      std::_Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>::~_Vector_base
                (&result_array.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>);
    }
    else {
      std::vector<int,_std::allocator<int>_>::_M_move_assign(&result->index,&sum.nonzeroinds);
      piVar6 = (result->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar8 = (result->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      std::vector<int,_std::allocator<int>_>::resize(&result->index,(long)this->num_col_);
      uVar11 = (ulong)((long)piVar8 - (long)piVar6) >> 2;
      iVar15 = (int)uVar11;
      result->count = iVar15;
      piVar6 = (result->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (result->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar14 = 0;
      uVar11 = uVar11 & 0xffffffff;
      if (iVar15 < 1) {
        uVar11 = uVar14;
      }
      for (; uVar11 != uVar14; uVar14 = uVar14 + 1) {
        iVar15 = piVar6[uVar14];
        pdVar7[iVar15] =
             sum.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
             super__Vector_impl_data._M_start[iVar15].hi +
             sum.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
             super__Vector_impl_data._M_start[iVar15].lo;
      }
    }
  }
  else if (from_index < column->count) {
    priceByRowDenseResult(this,&result->array,column,from_index,-2);
    result->count = 0;
    piVar6 = (result->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (result->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar12 = 0; lVar12 < this->num_col_; lVar12 = lVar12 + 1) {
      if (1e-14 <= ABS(pdVar7[lVar12])) {
        iVar15 = result->count;
        result->count = iVar15 + 1;
        piVar6[iVar15] = (int)lVar12;
      }
      else {
        pdVar7[lVar12] = 0.0;
      }
    }
  }
  else {
    HVectorBase<double>::tight(result);
  }
  HighsSparseVectorSum::~HighsSparseVectorSum(&sum);
  return;
}

Assistant:

void HighsSparseMatrix::priceByRowWithSwitch(
    const bool quad_precision, HVector& result, const HVector& column,
    const double expected_density, const HighsInt from_index,
    const double switch_density, const HighsInt debug_report) const {
  assert(this->isRowwise());
  HighsSparseVectorSum sum;
  // todo @Julian: Setting up the sparse vector sum is equivalent to calling
  // HVector::setup() I think there should instead be overloads where the result
  // vector is of type HVectorQuad for the future and not the boolean parameter
  // quad_precision. Then the buffer can be maintained similar to row_ap.
  if (quad_precision) sum.setDimension(num_col_);
  if (debug_report >= kDebugReportAll)
    printf("\nHighsSparseMatrix::priceByRowWithSwitch\n");
  // (Continue) hyper-sparse row-wise PRICE with possible switches to
  // standard row-wise PRICE either immediately based on historical
  // density or during hyper-sparse PRICE if there is too much fill-in
  HighsInt next_index = from_index;
  // Possibly don't perform hyper-sparse PRICE based on historical density
  //
  // Ensure that result was set up for this number of columns, and
  // that result.index is still of correct size
  assert(HighsInt(result.size) == this->num_col_);
  assert(HighsInt(result.index.size()) == this->num_col_);
  if (expected_density <= kHyperPriceDensity) {
    double inv_num_col = 1.0 / this->num_col_;
    for (HighsInt ix = next_index; ix < column.count; ix++) {
      HighsInt iRow = column.index[ix];
      // Determine whether p_end_ or the next start_ ends the loop
      HighsInt to_iEl;
      if (this->format_ == MatrixFormat::kRowwisePartitioned) {
        to_iEl = this->p_end_[iRow];
      } else {
        to_iEl = this->start_[iRow + 1];
      }
      // Possibly switch to standard row-wise price
      HighsInt row_num_nz = to_iEl - this->start_[iRow];
      double local_density = (1.0 * result.count) * inv_num_col;
      bool switch_to_dense = result.count + row_num_nz >= this->num_col_ ||
                             local_density > switch_density;
      if (switch_to_dense) break;
      double multiplier = column.array[iRow];
      if (debug_report == kDebugReportAll || debug_report == iRow)
        debugReportRowPrice(iRow, multiplier, to_iEl, result.array);
      if (multiplier) {
        if (quad_precision) {
          for (HighsInt iEl = this->start_[iRow]; iEl < to_iEl; iEl++) {
            sum.add(this->index_[iEl], multiplier * this->value_[iEl]);
          }
        } else {
          for (HighsInt iEl = this->start_[iRow]; iEl < to_iEl; iEl++) {
            HighsInt iCol = this->index_[iEl];
            double value0 = result.array[iCol];
            double value1 = value0 + multiplier * this->value_[iEl];
            if (value0 == 0) result.index[result.count++] = iCol;
            result.array[iCol] =
                (fabs(value1) < kHighsTiny) ? kHighsZero : value1;
          }
        }
      }
      next_index = ix + 1;
    }
  }
  if (quad_precision)
    sum.cleanup([](HighsInt, double x) { return std::abs(x) <= kHighsTiny; });
  if (next_index < column.count) {
    // PRICE is not complete: finish without maintaining nonzeros of result
    if (quad_precision) {
      std::vector<HighsCDouble> result_array = sum.values;
      this->priceByRowDenseResult(result_array, column, next_index);
      // Determine indices of nonzeros in result
      result.count = 0;
      for (HighsInt iCol = 0; iCol < this->num_col_; iCol++) {
        double value1 = (double)result_array[iCol];
        if (fabs(value1) < kHighsTiny) {
          result.array[iCol] = 0;
        } else {
          result.array[iCol] = value1;
          result.index[result.count++] = iCol;
        }
      }
    } else {
      this->priceByRowDenseResult(result.array, column, next_index);
      // Determine indices of nonzeros in result
      result.count = 0;
      for (HighsInt iCol = 0; iCol < this->num_col_; iCol++) {
        double value1 = result.array[iCol];
        if (fabs(value1) < kHighsTiny) {
          result.array[iCol] = 0;
        } else {
          result.index[result.count++] = iCol;
        }
      }
    }
  } else {
    if (quad_precision) {
      // HVector result should have result.index of size this->num_col_
      // by virtue of result.setup. However, it will generally lose
      // this property by virtue of the following move
      result.index = std::move(sum.nonzeroinds);
      HighsInt result_num_nz = result.index.size();
      // Restore the size of result.index
      result.index.resize(this->num_col_);
      result.count = result_num_nz;
      for (HighsInt i = 0; i < result_num_nz; ++i) {
        HighsInt iRow = result.index[i];
        result.array[iRow] = sum.getValue(iRow);
      }
    } else {
      // PRICE is complete maintaining nonzeros of result
      // Remove small values
      result.tight();
    }
  }
}